

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimics_pcre.cc
# Opt level: O2

bool __thiscall
re2::PCREWalker::PostVisit
          (PCREWalker *this,Regexp *re,bool parent_arg,bool pre_arg,bool *child_args,int nchild_args
          )

{
  bool *pbVar1;
  bool bVar2;
  Rune RVar3;
  int iVar4;
  ulong uVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  ulong uVar7;
  
  uVar5 = 0;
  uVar7 = (ulong)(uint)nchild_args;
  if (nchild_args < 1) {
    uVar7 = uVar5;
  }
  do {
    if (uVar7 == uVar5) {
      switch(re->op_) {
      case '\x02':
      case '\x13':
        if ((short)re->parse_flags_ < 0) {
          return false;
        }
        break;
      case '\x03':
        RVar3 = Regexp::rune(re);
        if (RVar3 == 0xb) {
          return false;
        }
        break;
      case '\n':
        iVar4 = Regexp::max(re);
        if (iVar4 != -1) {
          return true;
        }
      case '\a':
      case '\b':
      case '\t':
        if (re->nsub_ < 2) {
          paVar6 = &re->field_5;
        }
        else {
          paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
        }
        bVar2 = CanBeEmptyString(paVar6->subone_);
        if (bVar2) {
          return false;
        }
        break;
      case '\x0e':
        goto LAB_0012db76;
      }
      return true;
    }
    pbVar1 = child_args + uVar5;
    uVar5 = uVar5 + 1;
  } while (*pbVar1 != false);
LAB_0012db76:
  return false;
}

Assistant:

bool PCREWalker::PostVisit(Regexp* re, bool parent_arg, bool pre_arg,
                           bool* child_args, int nchild_args) {
  // If children failed, so do we.
  for (int i = 0; i < nchild_args; i++)
    if (!child_args[i])
      return false;

  // Otherwise look for other reasons to fail.
  switch (re->op()) {
    // Look for repeated empty string.
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      if (CanBeEmptyString(re->sub()[0]))
        return false;
      break;
    case kRegexpRepeat:
      if (re->max() == -1 && CanBeEmptyString(re->sub()[0]))
        return false;
      break;

    // Look for \v
    case kRegexpLiteral:
      if (re->rune() == '\v')
        return false;
      break;

    // Look for $ in single-line mode.
    case kRegexpEndText:
    case kRegexpEmptyMatch:
      if (re->parse_flags() & Regexp::WasDollar)
        return false;
      break;

    // Look for ^ in multi-line mode.
    case kRegexpBeginLine:
      // No condition: in single-line mode ^ becomes kRegexpBeginText.
      return false;

    default:
      break;
  }

  // Not proven guilty.
  return true;
}